

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::OnTick(CGameContext *this)

{
  int iVar1;
  IServer *pIVar2;
  IConsole *pIVar3;
  int64 iVar4;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  int j;
  int ActVotePos;
  int ActVote;
  int i_2;
  int i_1;
  int No;
  int Yes;
  int Total;
  int i;
  bool aVoteChecked [64];
  char aaBuf [64] [48];
  int in_stack_fffffffffffff378;
  undefined1 Force;
  int in_stack_fffffffffffff37c;
  undefined4 in_stack_fffffffffffff388;
  int in_stack_fffffffffffff38c;
  int local_c70;
  int local_c6c;
  int local_c68;
  uint local_c64;
  undefined4 in_stack_fffffffffffff3a0;
  int iVar5;
  undefined4 in_stack_fffffffffffff3a4;
  int iVar6;
  int local_c58;
  int local_c54;
  CGameContext *this_00;
  byte local_c48 [64];
  undefined1 local_c08 [3072];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CheckPureTuning((CGameContext *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378));
  memcpy(&(in_RDI->m_World).m_Core,&in_RDI->m_Tuning,0x80);
  CGameWorld::Tick((CGameWorld *)this_00);
  (*in_RDI->m_pController->_vptr_IGameController[10])();
  for (local_c54 = 0; local_c54 < 0x40; local_c54 = local_c54 + 1) {
    if (in_RDI->m_apPlayers[local_c54] != (CPlayer *)0x0) {
      CPlayer::Tick((CPlayer *)CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0));
      CPlayer::PostTick((CPlayer *)in_RDI);
    }
  }
  if (in_RDI->m_VoteCloseTime != 0) {
    if (in_RDI->m_VoteCloseTime == -1) {
      EndVote(in_RDI,in_stack_fffffffffffff37c,SUB41((uint)in_stack_fffffffffffff378 >> 0x18,0));
    }
    else {
      local_c58 = 0;
      iVar6 = 0;
      iVar5 = 0;
      if ((in_RDI->m_VoteUpdate & 1U) != 0) {
        memset(local_c08,0,0xc00);
        for (local_c64 = 0; (int)local_c64 < 0x40; local_c64 = local_c64 + 1) {
          if (in_RDI->m_apPlayers[(int)local_c64] != (CPlayer *)0x0) {
            pIVar2 = Server(in_RDI);
            (*(pIVar2->super_IInterface)._vptr_IInterface[7])
                      (pIVar2,(ulong)local_c64,local_c08 + (long)(int)local_c64 * 0x30,0x30);
          }
        }
        memset(local_c48,0,0x40);
        for (local_c68 = 0; local_c68 < 0x40; local_c68 = local_c68 + 1) {
          if (((in_RDI->m_apPlayers[local_c68] != (CPlayer *)0x0) &&
              (iVar1 = CPlayer::GetTeam(in_RDI->m_apPlayers[local_c68]), iVar1 != -1)) &&
             ((local_c48[local_c68] & 1) == 0)) {
            local_c6c = in_RDI->m_apPlayers[local_c68]->m_Vote;
            local_c70 = in_RDI->m_apPlayers[local_c68]->m_VotePos;
            in_stack_fffffffffffff38c = local_c68;
            while (in_stack_fffffffffffff38c = in_stack_fffffffffffff38c + 1,
                  in_stack_fffffffffffff38c < 0x40) {
              if ((((in_RDI->m_apPlayers[in_stack_fffffffffffff38c] != (CPlayer *)0x0) &&
                   ((local_c48[in_stack_fffffffffffff38c] & 1) == 0)) &&
                  ((iVar1 = str_comp((char *)in_RDI,
                                     (char *)CONCAT44(in_stack_fffffffffffff37c,
                                                      in_stack_fffffffffffff378)), iVar1 == 0 &&
                   (local_c48[in_stack_fffffffffffff38c] = 1,
                   in_RDI->m_apPlayers[in_stack_fffffffffffff38c]->m_Vote != 0)))) &&
                 ((local_c6c == 0 ||
                  (in_RDI->m_apPlayers[in_stack_fffffffffffff38c]->m_VotePos < local_c70)))) {
                local_c6c = in_RDI->m_apPlayers[in_stack_fffffffffffff38c]->m_Vote;
                local_c70 = in_RDI->m_apPlayers[in_stack_fffffffffffff38c]->m_VotePos;
              }
            }
            local_c58 = local_c58 + 1;
            if (local_c6c < 1) {
              if (local_c6c < 0) {
                iVar5 = iVar5 + 1;
              }
            }
            else {
              iVar6 = iVar6 + 1;
            }
          }
        }
      }
      if ((in_RDI->m_VoteEnforce == 1) ||
         (((in_RDI->m_VoteUpdate & 1U) != 0 &&
          (in_stack_fffffffffffff37c = iVar6, local_c58 / 2 + 1 <= iVar6)))) {
        pIVar2 = Server(in_RDI);
        Force = (undefined1)((uint)in_stack_fffffffffffff378 >> 0x18);
        (*(pIVar2->super_IInterface)._vptr_IInterface[0x12])(pIVar2,0xfffffffe);
        pIVar3 = Console(in_RDI);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,in_RDI->m_aVoteCommand);
        pIVar2 = Server(in_RDI);
        (*(pIVar2->super_IInterface)._vptr_IInterface[0x12])(pIVar2,0xffffffff);
        if ((in_RDI->m_VoteCreator != -1) &&
           (in_RDI->m_apPlayers[in_RDI->m_VoteCreator] != (CPlayer *)0x0)) {
          in_RDI->m_apPlayers[in_RDI->m_VoteCreator]->m_LastVoteCallTick = 0;
        }
        EndVote(in_RDI,in_stack_fffffffffffff37c,(bool)Force);
      }
      else if ((in_RDI->m_VoteEnforce == -1) ||
              ((((in_RDI->m_VoteUpdate & 1U) != 0 &&
                (in_stack_fffffffffffff378 = iVar5, (local_c58 + 1) / 2 <= iVar5)) ||
               (iVar4 = time_get(), in_RDI->m_VoteCloseTime < iVar4)))) {
        EndVote(in_RDI,in_stack_fffffffffffff37c,SUB41((uint)in_stack_fffffffffffff378 >> 0x18,0));
      }
      else if ((in_RDI->m_VoteUpdate & 1U) != 0) {
        in_RDI->m_VoteUpdate = false;
        SendVoteStatus((CGameContext *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388)
                       ,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffff37c,
                       in_stack_fffffffffffff378);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameContext::OnTick()
{
	// check tuning
	CheckPureTuning();

	// copy tuning
	m_World.m_Core.m_Tuning = m_Tuning;
	m_World.Tick();

	//if(world.paused) // make sure that the game object always updates
	m_pController->Tick();

	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i])
		{
			m_apPlayers[i]->Tick();
			m_apPlayers[i]->PostTick();
		}
	}

	// update voting
	if(m_VoteCloseTime)
	{
		// abort the kick-vote on player-leave
		if(m_VoteCloseTime == -1)
			EndVote(VOTE_END_ABORT, false);
		else
		{
			int Total = 0, Yes = 0, No = 0;
			if(m_VoteUpdate)
			{
				// count votes
				char aaBuf[MAX_CLIENTS][NETADDR_MAXSTRSIZE] = {{0}};
				for(int i = 0; i < MAX_CLIENTS; i++)
					if(m_apPlayers[i])
						Server()->GetClientAddr(i, aaBuf[i], NETADDR_MAXSTRSIZE);
				bool aVoteChecked[MAX_CLIENTS] = {0};
				for(int i = 0; i < MAX_CLIENTS; i++)
				{
					if(!m_apPlayers[i] || m_apPlayers[i]->GetTeam() == TEAM_SPECTATORS || aVoteChecked[i])	// don't count in votes by spectators
						continue;

					int ActVote = m_apPlayers[i]->m_Vote;
					int ActVotePos = m_apPlayers[i]->m_VotePos;

					// check for more players with the same ip (only use the vote of the one who voted first)
					for(int j = i+1; j < MAX_CLIENTS; ++j)
					{
						if(!m_apPlayers[j] || aVoteChecked[j] || str_comp(aaBuf[j], aaBuf[i]))
							continue;

						aVoteChecked[j] = true;
						if(m_apPlayers[j]->m_Vote && (!ActVote || ActVotePos > m_apPlayers[j]->m_VotePos))
						{
							ActVote = m_apPlayers[j]->m_Vote;
							ActVotePos = m_apPlayers[j]->m_VotePos;
						}
					}

					Total++;
					if(ActVote > 0)
						Yes++;
					else if(ActVote < 0)
						No++;
				}
			}

			if(m_VoteEnforce == VOTE_CHOICE_YES || (m_VoteUpdate && Yes >= Total/2+1))
			{
				Server()->SetRconCID(IServer::RCON_CID_VOTE);
				Console()->ExecuteLine(m_aVoteCommand);
				Server()->SetRconCID(IServer::RCON_CID_SERV);
				if(m_VoteCreator != -1 && m_apPlayers[m_VoteCreator])
					m_apPlayers[m_VoteCreator]->m_LastVoteCallTick = 0;

				EndVote(VOTE_END_PASS, m_VoteEnforce == VOTE_CHOICE_YES);
			}
			else if(m_VoteEnforce == VOTE_CHOICE_NO || (m_VoteUpdate && No >= (Total+1)/2) || time_get() > m_VoteCloseTime)
				EndVote(VOTE_END_FAIL, m_VoteEnforce == VOTE_CHOICE_NO);
			else if(m_VoteUpdate)
			{
				m_VoteUpdate = false;
				SendVoteStatus(-1, Total, Yes, No);
			}
		}
	}


#ifdef CONF_DEBUG
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i] && m_apPlayers[i]->IsDummy())
		{
			CNetObj_PlayerInput Input = {0};
			Input.m_Direction = (i&1)?-1:1;
			m_apPlayers[i]->OnPredictedInput(&Input);
		}
	}
#endif
}